

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotCreateUpdateForm.cpp
# Opt level: O0

void __thiscall
SlotCreateUpdateForm::SlotCreateUpdateForm
          (SlotCreateUpdateForm *this,Professor *requestedBy,Room *room,DateTime *startTime,
          DateTime *endTime,char *passedReason,int approved,Slot *passedInstance)

{
  char *local_40;
  char *passedReason_local;
  DateTime *endTime_local;
  DateTime *startTime_local;
  Room *room_local;
  Professor *requestedBy_local;
  SlotCreateUpdateForm *this_local;
  
  ModelForm<Slot>::ModelForm(&this->super_ModelForm<Slot>);
  (this->super_ModelForm<Slot>).super_Form._vptr_Form = (_func_int **)&PTR_clean_0016b288;
  Professor::Professor(&this->requestedBy,requestedBy);
  Room::Room(&this->room,room);
  memcpy(&this->startTime,startTime,0x28);
  memcpy(&this->endTime,endTime,0x28);
  local_40 = this->reason;
  do {
    *local_40 = '\0';
    local_40 = local_40 + 1;
  } while ((int *)local_40 != &this->approved);
  this->approved = approved;
  strcpy(this->reason,passedReason);
  (this->super_ModelForm<Slot>).instance = passedInstance;
  return;
}

Assistant:

SlotCreateUpdateForm::SlotCreateUpdateForm(const Professor &requestedBy, const Room &room, const DateTime &startTime,
                                           const DateTime &endTime, const char *passedReason, int approved,
                                           Slot *passedInstance) : requestedBy(requestedBy), room(room),
                                                                   startTime(startTime), endTime(endTime),
                                                                   approved(approved) {
    strcpy(reason, passedReason);
    instance = passedInstance;
}